

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O3

bool __thiscall duckdb::Pipeline::IsOrderDependent(Pipeline *this)

{
  pointer prVar1;
  PhysicalOperator *pPVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  DBConfig *pDVar6;
  reference_wrapper<duckdb::PhysicalOperator> *op_ref;
  pointer prVar7;
  bool bVar8;
  
  pDVar6 = DBConfig::GetConfig(this->executor->context);
  if ((this->source).ptr != (PhysicalOperator *)0x0) {
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->source);
    uVar4 = (*((this->source).ptr)->_vptr_PhysicalOperator[0x16])();
    if ((char)uVar4 == '\x02') {
      return true;
    }
    if ((uVar4 & 0xff) == 0) {
      return false;
    }
  }
  prVar7 = (this->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (this->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (prVar7 == prVar1) {
      if (((pDVar6->options).preserve_insertion_order == true) &&
         ((this->sink).ptr != (PhysicalOperator *)0x0)) {
        optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->sink);
        iVar5 = (*((this->sink).ptr)->_vptr_PhysicalOperator[0x24])();
        if ((char)iVar5 != '\0') {
          return true;
        }
      }
      return false;
    }
    pPVar2 = prVar7->_M_data;
    iVar5 = (*pPVar2->_vptr_PhysicalOperator[0xe])(pPVar2);
    bVar8 = (char)iVar5 == '\0';
    bVar3 = !bVar8;
    if (bVar8) {
      return bVar3;
    }
    iVar5 = (*pPVar2->_vptr_PhysicalOperator[0xe])(pPVar2);
    if ((char)iVar5 == '\x02') break;
    prVar7 = prVar7 + 1;
  }
  return bVar3;
}

Assistant:

bool Pipeline::IsOrderDependent() const {
	auto &config = DBConfig::GetConfig(executor.context);
	if (source) {
		auto source_order = source->SourceOrder();
		if (source_order == OrderPreservationType::FIXED_ORDER) {
			return true;
		}
		if (source_order == OrderPreservationType::NO_ORDER) {
			return false;
		}
	}
	for (auto &op_ref : operators) {
		auto &op = op_ref.get();
		if (op.OperatorOrder() == OrderPreservationType::NO_ORDER) {
			return false;
		}
		if (op.OperatorOrder() == OrderPreservationType::FIXED_ORDER) {
			return true;
		}
	}
	if (!config.options.preserve_insertion_order) {
		return false;
	}
	if (sink && sink->SinkOrderDependent()) {
		return true;
	}
	return false;
}